

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<long,char[6]>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,long *args,
                   char (*args_1) [6])

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  cmAlphaNum local_90;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  size_t local_50;
  char *pcStack_48;
  size_t local_40;
  char *pcStack_38;
  size_t local_30;
  char (*local_28) [6];
  
  local_60._M_len = (a->View_)._M_len;
  local_60._M_str = (a->View_)._M_str;
  local_50 = (b->View_)._M_len;
  pcStack_48 = (b->View_)._M_str;
  cmAlphaNum::cmAlphaNum(&local_90,*args);
  local_40 = local_90.View_._M_len;
  pcStack_38 = local_90.View_._M_str;
  local_30 = strlen(*args_1);
  views._M_len = 4;
  views._M_array = &local_60;
  local_28 = args_1;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}